

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_sectors.cpp
# Opt level: O0

double __thiscall sector_t::GetFriction(sector_t *this,int plane,double *pMoveFac)

{
  int iVar1;
  FTerrainDef *pFVar2;
  FTerrainDef *terrain;
  double *pMoveFac_local;
  int plane_local;
  sector_t *this_local;
  
  if ((this->Flags & 0x10) == 0) {
    iVar1 = GetTerrain(this,plane);
    pFVar2 = TArray<FTerrainDef,_FTerrainDef>::operator[](&Terrains,(long)iVar1);
    if ((pFVar2->Friction != 0.0) || (NAN(pFVar2->Friction))) {
      if (pMoveFac != (double *)0x0) {
        *pMoveFac = pFVar2->MoveFactor;
      }
      this_local = (sector_t *)pFVar2->Friction;
    }
    else {
      if (pMoveFac != (double *)0x0) {
        *pMoveFac = 0.03125;
      }
      this_local = (sector_t *)0x3fed000000000000;
    }
  }
  else {
    if (pMoveFac != (double *)0x0) {
      *pMoveFac = this->movefactor;
    }
    this_local = (sector_t *)this->friction;
  }
  return (double)this_local;
}

Assistant:

double sector_t::GetFriction(int plane, double *pMoveFac) const
{
	if (Flags & SECF_FRICTION) 
	{ 
		if (pMoveFac) *pMoveFac = movefactor;
		return friction; 
	}
	FTerrainDef *terrain = &Terrains[GetTerrain(plane)];
	if (terrain->Friction != 0)
	{
		if (pMoveFac) *pMoveFac = terrain->MoveFactor;
		return terrain->Friction;
	}
	else
	{
		if (pMoveFac) *pMoveFac = ORIG_FRICTION_FACTOR;
		return ORIG_FRICTION;
	}
}